

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O0

collision_shape_ptr __thiscall
APhyBullet::BulletEngine::createCylinderZ
          (BulletEngine *this,aphy_scalar half_width,aphy_scalar half_height,aphy_scalar half_depth)

{
  Counter *this_00;
  btVector3 *in_stack_ffffffffffffffa8;
  btCylinderShapeZ *args;
  btCylinderShapeZ *in_stack_ffffffffffffffb0;
  btVector3 local_30;
  undefined1 local_20 [16];
  btScalar local_10;
  btScalar local_c [3];
  
  btCylinderShapeZ::operator_new(0x127e65);
  btVector3::btVector3(&local_30,local_c,&local_10,(btScalar *)(local_20 + 0xc));
  btCylinderShapeZ::btCylinderShapeZ(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  args = (btCylinderShapeZ *)local_20;
  aphy::makeObject<APhyBullet::BulletCollisionShape,btCylinderShapeZ*>(args);
  this_00 = aphy::ref<aphy::collision_shape>::disown((ref<aphy::collision_shape> *)args);
  aphy::ref<aphy::collision_shape>::~ref((ref<aphy::collision_shape> *)this_00);
  return this_00;
}

Assistant:

collision_shape_ptr BulletEngine::createCylinderZ(aphy_scalar half_width, aphy_scalar half_height, aphy_scalar half_depth)
{
    return makeObject<BulletCollisionShape> (
        new btCylinderShapeZ(btVector3(half_width, half_height, half_depth))
    ).disown();
}